

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_logging_cfg.c
# Opt level: O1

int oonf_logcfg_schema_validate(cfg_schema_entry *entry,char *section_name,char *value,autobuf *out)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  while ((LOG_SOURCE_NAMES[lVar2] == (char *)0x0 ||
         (iVar1 = strcasecmp(value,LOG_SOURCE_NAMES[lVar2]), iVar1 != 0))) {
    lVar2 = lVar2 + 1;
    if (lVar2 == 0x80) {
      cfg_append_printable_line
                (out,"Unknown value \'%s\' for entry \'%s\' in section %s",value,(entry->key).entry,
                 section_name);
      return -1;
    }
  }
  return 0;
}

Assistant:

int
oonf_logcfg_schema_validate(
  const struct cfg_schema_entry *entry, const char *section_name, const char *value, struct autobuf *out) {
  int i;

  for (i = 0; i < LOG_MAXIMUM_SOURCES; i++) {
    if (LOG_SOURCE_NAMES[i] != 0 && strcasecmp(value, LOG_SOURCE_NAMES[i]) == 0) {
      return 0;
    }
  }

  cfg_append_printable_line(out,
    "Unknown value '%s'"
    " for entry '%s' in section %s",
    value, entry->key.entry, section_name);
  return -1;
}